

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::BlobProto::ByteSizeLong(BlobProto *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int32 iVar4;
  UnknownFieldSet *unknown_fields;
  size_t sVar5;
  size_t sVar6;
  int cached_size;
  int cached_size_4;
  size_t data_size_3;
  uint count_3;
  int cached_size_3;
  size_t data_size_2;
  uint count_2;
  int cached_size_2;
  size_t data_size_1;
  uint count_1;
  int cached_size_1;
  size_t data_size;
  size_t sStack_38;
  uint count;
  size_t total_size;
  BlobProto *this_local;
  
  sStack_38 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = BlobProto::unknown_fields(this);
    sStack_38 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  uVar2 = BlobProto::data_size(this);
  sVar5 = (ulong)uVar2 * 4;
  if ((ulong)uVar2 != 0) {
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar5);
    sStack_38 = sVar6 + 1 + sStack_38;
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sVar5);
  this->_data_cached_byte_size_ = iVar3;
  sStack_38 = sVar5 + sStack_38;
  uVar2 = diff_size(this);
  sVar5 = (ulong)uVar2 * 4;
  if ((ulong)uVar2 != 0) {
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar5);
    sStack_38 = sVar6 + 1 + sStack_38;
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sVar5);
  this->_diff_cached_byte_size_ = iVar3;
  sStack_38 = sVar5 + sStack_38;
  uVar2 = double_data_size(this);
  sVar5 = (ulong)uVar2 * 8;
  if ((ulong)uVar2 != 0) {
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar5);
    sStack_38 = sVar6 + 1 + sStack_38;
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sVar5);
  this->_double_data_cached_byte_size_ = iVar3;
  sStack_38 = sVar5 + sStack_38;
  uVar2 = double_diff_size(this);
  sVar5 = (ulong)uVar2 * 8;
  if ((ulong)uVar2 != 0) {
    sVar6 = google::protobuf::internal::WireFormatLite::Int32Size((int32)sVar5);
    sStack_38 = sVar6 + 1 + sStack_38;
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sVar5);
  this->_double_diff_cached_byte_size_ = iVar3;
  sStack_38 = sVar5 + sStack_38;
  if (((this->_has_bits_).has_bits_[0] & 0x1f) != 0) {
    bVar1 = has_shape(this);
    if (bVar1) {
      sVar5 = google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual<caffe::BlobShape>
                        (this->shape_);
      sStack_38 = sVar5 + 1 + sStack_38;
    }
    bVar1 = has_num(this);
    if (bVar1) {
      iVar4 = num(this);
      sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar4);
      sStack_38 = sVar5 + 1 + sStack_38;
    }
    bVar1 = has_channels(this);
    if (bVar1) {
      iVar4 = channels(this);
      sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar4);
      sStack_38 = sVar5 + 1 + sStack_38;
    }
    bVar1 = has_height(this);
    if (bVar1) {
      iVar4 = height(this);
      sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar4);
      sStack_38 = sVar5 + 1 + sStack_38;
    }
    bVar1 = has_width(this);
    if (bVar1) {
      iVar4 = width(this);
      sVar5 = google::protobuf::internal::WireFormatLite::Int32Size(iVar4);
      sStack_38 = sVar5 + 1 + sStack_38;
    }
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_38);
  this->_cached_size_ = iVar3;
  return sStack_38;
}

Assistant:

size_t BlobProto::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.BlobProto)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // repeated float data = 5 [packed = true];
  {
    unsigned int count = this->data_size();
    size_t data_size = 4UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _data_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated float diff = 6 [packed = true];
  {
    unsigned int count = this->diff_size();
    size_t data_size = 4UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _diff_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated double double_data = 8 [packed = true];
  {
    unsigned int count = this->double_data_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _double_data_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated double double_diff = 9 [packed = true];
  {
    unsigned int count = this->double_diff_size();
    size_t data_size = 8UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _double_diff_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  if (_has_bits_[0 / 32] & 31u) {
    // optional .caffe.BlobShape shape = 7;
    if (has_shape()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->shape_);
    }

    // optional int32 num = 1 [default = 0];
    if (has_num()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->num());
    }

    // optional int32 channels = 2 [default = 0];
    if (has_channels()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->channels());
    }

    // optional int32 height = 3 [default = 0];
    if (has_height()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->height());
    }

    // optional int32 width = 4 [default = 0];
    if (has_width()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->width());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}